

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::NewClassExpression::fromSyntax
          (Compilation *comp,SuperNewDefaultedArgsExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  bool bVar1;
  BumpAllocator *this;
  SourceLocation args;
  Scope *pSVar2;
  Symbol *pSVar3;
  bitmask<slang::ast::MethodFlags> *r;
  SourceRange SVar4;
  SubroutineSymbol *sub;
  type_conflict1 *isSuperClass;
  type *classType;
  SourceRange range;
  Type **in_stack_000000d0;
  ASTContext *in_stack_000000d8;
  NameSyntax *in_stack_000000e0;
  undefined1 in_stack_000000e8 [16];
  Expression *in_stack_ffffffffffffff58;
  Compilation *in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7a;
  bitmask<slang::ast::MethodFlags> in_stack_ffffffffffffff7e;
  SourceLocation in_stack_ffffffffffffff80;
  SyntaxNode *in_stack_ffffffffffffffb0;
  SourceLocation SStack_30;
  NewClassExpression *local_8;
  
  SVar4 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffffb0);
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x9c6d2f);
  SStack_30 = SVar4.endLoc;
  resolveNewClassTarget
            (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,(SourceRange)in_stack_000000e8);
  this = (BumpAllocator *)
         std::get<0ul,slang::ast::ClassType_const*,bool>
                   ((pair<const_slang::ast::ClassType_*,_bool> *)0x9c6d80);
  args = (SourceLocation)
         std::get<1ul,slang::ast::ClassType_const*,bool>
                   ((pair<const_slang::ast::ClassType_*,_bool> *)0x9c6d8f);
  if ((type)this->head == (type)0x0) {
    local_8 = (NewClassExpression *)
              Expression::badExpr(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    pSVar2 = not_null<const_slang::ast::Scope_*>::operator->
                       ((not_null<const_slang::ast::Scope_*> *)0x9c6dce);
    pSVar3 = Scope::asSymbol(pSVar2);
    if (pSVar3->kind == Subroutine) {
      pSVar2 = not_null<const_slang::ast::Scope_*>::operator->
                         ((not_null<const_slang::ast::Scope_*> *)0x9c6dec);
      Scope::asSymbol(pSVar2);
      in_stack_ffffffffffffff80 =
           (SourceLocation)Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x9c6dfc);
      r = (bitmask<slang::ast::MethodFlags> *)((long)in_stack_ffffffffffffff80 + 0xc4);
      bitmask<slang::ast::MethodFlags>::bitmask
                ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffff7e,DefaultedSuperArg);
      bVar1 = bitmask<slang::ast::MethodFlags>::has
                        ((bitmask<slang::ast::MethodFlags> *)in_stack_ffffffffffffff60,r);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        in_stack_ffffffffffffff7a = 0x670007;
        SVar4.endLoc = args;
        SVar4.startLoc = in_stack_ffffffffffffff80;
        ASTContext::addDiag((ASTContext *)
                            CONCAT26(in_stack_ffffffffffffff7e.m_bits,
                                     CONCAT42(0x670007,in_stack_ffffffffffffff78)),
                            SUB84((ulong)this >> 0x20,0),SVar4);
        in_stack_ffffffffffffff70 = SStack_30;
      }
    }
    local_8 = BumpAllocator::
              emplace<slang::ast::NewClassExpression,slang::ast::Type_const&,decltype(nullptr),bool&,slang::SourceRange&>
                        (this,(Type *)args,(void **)in_stack_ffffffffffffff80,
                         (bool *)CONCAT26(in_stack_ffffffffffffff7e.m_bits,
                                          CONCAT42(in_stack_ffffffffffffff7a,
                                                   in_stack_ffffffffffffff78)),
                         (SourceRange *)in_stack_ffffffffffffff70);
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& NewClassExpression::fromSyntax(Compilation& comp,
                                           const SuperNewDefaultedArgsExpressionSyntax& syntax,
                                           const ASTContext& context,
                                           const Type* assignmentTarget) {
    SourceRange range = syntax.sourceRange();
    auto [classType, isSuperClass] = resolveNewClassTarget(*syntax.scopedNew, context,
                                                           assignmentTarget, range);
    if (!classType)
        return badExpr(comp, nullptr);

    SLANG_ASSERT(isSuperClass);

    // The containing constructor (should be our parent scope)
    // must have a 'default' argument as well.
    if (context.scope->asSymbol().kind == SymbolKind::Subroutine) {
        auto& sub = context.scope->asSymbol().as<SubroutineSymbol>();
        if (!sub.flags.has(MethodFlags::DefaultedSuperArg))
            context.addDiag(diag::InvalidSuperNewDefault, range);
    }

    return *comp.emplace<NewClassExpression>(*assignmentTarget, nullptr, isSuperClass, range);
}